

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_std::utf8_time_put_from_wide::do_put
          (utf8_time_put_from_wide *this,iter_type out,ios_base *param_2,char fill,tm *tm,
          char format,char modifier)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  time_put *ptVar4;
  ulong uVar5;
  uint uVar6;
  streambuf_type *psVar7;
  ulong uVar8;
  iter_type iVar9;
  locale local_210;
  string tmp;
  string local_1e8;
  wstring wtmp;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> wtmps;
  ios_base local_138 [120];
  long alStack_c0 [18];
  
  psVar7 = out._M_sbuf;
  uVar6 = out._8_4_;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&wtmps);
  std::wios::imbue(&local_210);
  std::locale::~locale(&local_210);
  ptVar4 = std::
           use_facet<std::time_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (&this->base_);
  lVar1 = *(long *)((long)alStack_c0 + *(long *)(_wtmps + -0x18));
  (**(code **)(*(long *)ptVar4 + 0x10))
            (ptVar4,lVar1,lVar1 == 0,&wtmps + *(long *)(_wtmps + -0x18),(int)fill,tm,(int)format,
             (int)modifier);
  std::__cxx11::wstringbuf::str();
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"UTF-8","");
  conv::from_utf<wchar_t>
            (&tmp,wtmp._M_dataplus._M_p,wtmp._M_dataplus._M_p + wtmp._M_string_length,&local_1e8,
             default_method);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if (tmp._M_string_length != 0) {
    uVar5 = 0;
    uVar8 = 1;
    do {
      if ((uVar6 & 1) == 0) {
        if (*(char **)(psVar7 + 0x28) < *(char **)(psVar7 + 0x30)) {
          **(char **)(psVar7 + 0x28) = tmp._M_dataplus._M_p[uVar5];
          *(long *)(psVar7 + 0x28) = *(long *)(psVar7 + 0x28) + 1;
        }
        else {
          iVar3 = (**(code **)(*(long *)psVar7 + 0x68))(psVar7,tmp._M_dataplus._M_p[uVar5]);
          uVar6 = uVar6 & 0xff;
          if (iVar3 == -1) {
            uVar6 = 1;
          }
        }
      }
      bVar2 = uVar8 < tmp._M_string_length;
      uVar5 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)wtmp._M_dataplus._M_p != &wtmp.field_2) {
    operator_delete(wtmp._M_dataplus._M_p);
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&wtmps);
  std::ios_base::~ios_base(local_138);
  iVar9._8_4_ = uVar6;
  iVar9._M_sbuf = psVar7;
  iVar9._12_4_ = 0;
  return iVar9;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,char fill,std::tm const *tm,char format,char modifier = 0) const
    {
        std::basic_ostringstream<wchar_t> wtmps;
        wtmps.imbue(base_);
        std::use_facet<std::time_put<wchar_t> >(base_).put(wtmps,wtmps,wchar_t(fill),tm,wchar_t(format),wchar_t(modifier));
        std::wstring wtmp=wtmps.str();
        std::string const tmp = conv::from_utf<wchar_t>(wtmp,"UTF-8");
        for(unsigned i=0;i<tmp.size();i++) {
            *out++ = tmp[i];
        }
        return out;
    }